

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O0

void __thiscall
HSimplexNla::setup(HSimplexNla *this,HighsLp *lp,HighsInt *basic_index,HighsOptions *options,
                  HighsTimer *timer,HighsSimplexAnalysis *analysis,
                  HighsSparseMatrix *factor_a_matrix,double factor_pivot_threshold)

{
  HighsOptions *in_RCX;
  HighsInt *in_RDX;
  undefined8 unaff_RBX;
  HighsLp *in_RSI;
  HSimplexNla *in_RDI;
  HighsTimer *in_R8;
  HighsSimplexAnalysis *in_R9;
  HFactor *unaff_retaddr;
  double *in_stack_00000010;
  HighsInt *in_stack_00000018;
  HighsInt in_stack_00000020;
  HighsLogOptions *in_stack_00000028;
  HighsInt in_stack_00000038;
  undefined1 use_original_HFactor_logic_;
  HSimplexNla *pHVar1;
  HighsInt num_basic_;
  
  pHVar1 = in_RDI;
  setLpAndScalePointers(in_RDI,in_RSI);
  num_basic_ = (HighsInt)((ulong)pHVar1 >> 0x20);
  in_RDI->basic_index_ = in_RDX;
  in_RDI->options_ = in_RCX;
  in_RDI->timer_ = in_R8;
  in_RDI->analysis_ = in_R9;
  in_RDI->report_ = false;
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7bc3ba);
  use_original_HFactor_logic_ = (undefined1)((ulong)in_R9 >> 0x38);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7bc3d0);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x7bc3e6);
  HFactor::setupGeneral
            (unaff_retaddr,(HighsInt)((ulong)unaff_RBX >> 0x20),(HighsInt)unaff_RBX,num_basic_,
             &in_RSI->num_col_,in_RDX,in_stack_00000010,in_stack_00000018,(double)in_RCX,
             (double)in_R8,in_stack_00000020,in_stack_00000028,(bool)use_original_HFactor_logic_,
             in_stack_00000038);
  return;
}

Assistant:

void HSimplexNla::setup(const HighsLp* lp, HighsInt* basic_index,
                        const HighsOptions* options, HighsTimer* timer,
                        HighsSimplexAnalysis* analysis,
                        const HighsSparseMatrix* factor_a_matrix,
                        const double factor_pivot_threshold) {
  this->setLpAndScalePointers(lp);
  this->basic_index_ = basic_index;
  this->options_ = options;
  this->timer_ = timer;
  this->analysis_ = analysis;
  this->report_ = false;
  this->factor_.setupGeneral(
      this->lp_->num_col_, this->lp_->num_row_, this->lp_->num_row_,
      factor_a_matrix->start_.data(), factor_a_matrix->index_.data(),
      factor_a_matrix->value_.data(), this->basic_index_,
      factor_pivot_threshold, this->options_->factor_pivot_tolerance,
      this->options_->highs_debug_level, &(this->options_->log_options));
  assert(debugCheckData("After HSimplexNla::setup") == HighsDebugStatus::kOk);
}